

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

RSA * daemon_get_rsa(size_t key_index)

{
  RSA *r;
  RSA *rsa;
  size_t key_index_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
  r = (RSA *)daemon_vars.keys.keys[key_index];
  if (r != (RSA *)0x0) {
    RSA_up_ref(r);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
  return (RSA *)r;
}

Assistant:

static RSA *daemon_get_rsa(size_t key_index)
{
    RSA *rsa;

    pthread_mutex_lock(&daemon_vars.keys.lock);
    rsa = daemon_vars.keys.keys[key_index];
    if (rsa)
        RSA_up_ref(rsa);
    pthread_mutex_unlock(&daemon_vars.keys.lock);

    return rsa;
}